

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O1

int nn_surveyor_send(nn_sockbase *self,nn_msg *msg)

{
  uint uVar1;
  uint32_t uVar2;
  int extraout_EAX;
  size_t sVar3;
  uint8_t *puVar4;
  void *hint;
  int iVar5;
  nn_msg *msg_00;
  nn_msg *vfptr;
  nn_msg *self_00;
  nn_sockbase *self_01;
  
  *(uint *)((long)&self[0x20].sock + 4) = *(int *)((long)&self[0x20].sock + 4) + 1U | 0x80000000;
  msg_00 = msg;
  self_00 = msg;
  sVar3 = nn_chunkref_size(&msg->sphdr);
  if (sVar3 != 0) {
    nn_surveyor_send_cold_1();
    uVar1 = *(uint *)((long)&self_00[5].hdrs.u + 8);
    if ((uVar1 < 7) && ((0x46U >> (uVar1 & 0x1f) & 1) != 0)) {
      iVar5 = -0x9523dfe;
      if (*(int *)((long)&self_00[8].body.u + 0x1c) == 1) {
        *(undefined4 *)((long)&self_00[8].body.u + 0x1c) = 0;
        iVar5 = -0x6e;
      }
    }
    else {
      do {
        do {
          vfptr = msg_00;
          uVar1 = nn_xsurveyor_recv((nn_sockbase *)self_00,msg_00);
          if (uVar1 != 0) {
            if (uVar1 == 0xfffffff5) {
              return -0xb;
            }
            self_01 = (nn_sockbase *)(ulong)uVar1;
            nn_surveyor_recv_cold_1();
            nn_sockbase_init(self_01,(nn_sockbase_vfptr *)vfptr,hint);
            nn_random_generate(self_01 + 1,4);
            nn_hash_init((nn_hash *)&self_01[1].sock);
            nn_fq_init((nn_fq *)&self_01[2].sock);
            return extraout_EAX;
          }
          sVar3 = nn_chunkref_size(&msg_00->sphdr);
        } while (sVar3 != 4);
        puVar4 = (uint8_t *)nn_chunkref_data(&msg_00->sphdr);
        uVar2 = nn_getl(puVar4);
      } while (uVar2 != *(uint32_t *)((long)&self_00[5].hdrs.u + 0xc));
      nn_chunkref_term(&msg_00->sphdr);
      iVar5 = 0;
      nn_chunkref_init(&msg_00->sphdr,0);
    }
    return iVar5;
  }
  nn_chunkref_term(&msg->sphdr);
  nn_chunkref_init(&msg->sphdr,4);
  puVar4 = (uint8_t *)nn_chunkref_data(&msg->sphdr);
  nn_putl(puVar4,*(uint32_t *)((long)&self[0x20].sock + 4));
  nn_msg_term((nn_msg *)&self[0x2f].sock);
  nn_msg_mv((nn_msg *)&self[0x2f].sock,msg);
  nn_msg_init(msg,0);
  if ((6 < *(uint *)&self[0x20].sock) ||
     (iVar5 = 1, (0x46U >> (*(uint *)&self[0x20].sock & 0x1f) & 1) == 0)) {
    uVar1 = nn_xsurveyor_events(self);
    iVar5 = 2;
    if ((uVar1 & 2) == 0) {
      return -0xb;
    }
  }
  nn_fsm_action((nn_fsm *)(self + 0x1b),iVar5);
  return 0;
}

Assistant:

static int nn_surveyor_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    /*  Generate new survey ID. */
    ++surveyor->surveyid;
    surveyor->surveyid |= 0x80000000;

    /*  Tag the survey body with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 4);
    nn_putl (nn_chunkref_data (&msg->sphdr), surveyor->surveyid);

    /*  Store the survey, so that it can be sent later on. */
    nn_msg_term (&surveyor->tosend);
    nn_msg_mv (&surveyor->tosend, msg);
    nn_msg_init (msg, 0);

    /*  Cancel any ongoing survey, if any. */
    if (nn_slow (nn_surveyor_inprogress (surveyor))) {

        /*  First check whether the survey can be sent at all. */
        if (!(nn_xsurveyor_events (&surveyor->xsurveyor.sockbase) &
              NN_SOCKBASE_EVENT_OUT))
            return -EAGAIN;

        /*  Cancel the current survey. */
        nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_CANCEL);

        return 0;
    }

    /*  Notify the state machine that the survey was started. */
    nn_fsm_action (&surveyor->fsm, NN_SURVEYOR_ACTION_START);

    return 0;
}